

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

int __thiscall CTcSymObjBase::has_superclass(CTcSymObjBase *this,CTcSymObj *sc_sym)

{
  CTPNSuperclass *pCVar1;
  int iVar2;
  CTcSymObjBase *this_00;
  CTPNSuperclass **ppCVar3;
  
  ppCVar3 = &this->sc_name_head_;
  while (pCVar1 = *ppCVar3, pCVar1 != (CTPNSuperclass *)0x0) {
    this_00 = (CTcSymObjBase *)
              CTcPrsSymtab::find(G_prs->global_symtab_,pCVar1->sym_txt_,pCVar1->sym_len_);
    if ((this_00 != (CTcSymObjBase *)0x0) &&
       (*(int *)&(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                 super_CVmHashEntry.field_0x24 == 2)) {
      if (this_00 == &sc_sym->super_CTcSymObjBase) break;
      iVar2 = has_superclass(this_00,sc_sym);
      if (iVar2 != 0) break;
    }
    ppCVar3 = &pCVar1->nxt_;
  }
  return (int)(pCVar1 != (CTPNSuperclass *)0x0);
}

Assistant:

int CTcSymObjBase::has_superclass(class CTcSymObj *sc_sym) const
{
    /* 
     *   Scan my direct superclasses.  For each one, check to see if my
     *   superclass matches the given superclass, or if my superclass
     *   inherits from the given superclass.  
     */
    for (CTPNSuperclass *entry = sc_name_head_ ; entry != 0 ;
         entry = entry->nxt_)
    {
        /* look up this symbol */
        CTcSymObj *entry_sym = (CTcSymObj *)G_prs->get_global_symtab()->find(
            entry->get_sym_txt(), entry->get_sym_len());

        /* 
         *   if the entry's symbol doesn't exist or isn't an object symbol,
         *   skip it 
         */
        if (entry_sym == 0 || entry_sym->get_type() != TC_SYM_OBJ)
            continue;

        /* 
         *   if it matches the given superclass, we've found the given
         *   superclass among our direct superclasses, so we definitely have
         *   the given superclass 
         */
        if (entry_sym == sc_sym)
            return TRUE;

        /* 
         *   ask the symbol if the given class is among its direct or
         *   indirect superclasses - if it's a superclass of my superclass,
         *   it's also my superclass 
         */
        if (entry_sym->has_superclass(sc_sym))
            return TRUE;
    }

    /* 
     *   we didn't find the given class anywhere among our superclasses or
     *   their superclasses, so it must not be a superclass of ours 
     */
    return FALSE;
}